

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  TrackerContext *pTVar1;
  
  this->m_runState = Failed;
  if (this->m_parent != (ITracker *)0x0) {
    (*this->m_parent->_vptr_ITracker[10])();
    if (this->m_parent != (ITracker *)0x0) {
      pTVar1 = this->m_ctx;
      pTVar1->m_currentTracker = this->m_parent;
      pTVar1->m_runState = CompletedCycle;
      return;
    }
  }
  __assert_fail("m_parent",
                "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O3/tests/catch2/catch.hpp"
                ,0x38a4,"void Catch::TestCaseTracking::TrackerBase::moveToParent()");
}

Assistant:

void TrackerBase::fail() {
        m_runState = Failed;
        if( m_parent )
            m_parent->markAsNeedingAnotherRun();
        moveToParent();
        m_ctx.completeCycle();
    }